

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall
QMainWindowLayout::setCorner(QMainWindowLayout *this,Corner corner,DockWidgetArea area)

{
  ulong uVar1;
  
  uVar1 = (ulong)corner;
  if (*(DockWidgetArea *)(this + uVar1 * 4 + 0x1a0) == area) {
    return;
  }
  *(DockWidgetArea *)(this + uVar1 * 4 + 0x1a0) = area;
  if ((*(int *)(this + 0x3c0) <= *(int *)(this + 0x3c8)) &&
     (*(int *)(this + 0x3c4) <= *(int *)(this + 0x3cc))) {
    *(DockWidgetArea *)(this + uVar1 * 4 + 0x4d8) = area;
  }
  (**(code **)(*(long *)this + 0x70))();
  return;
}

Assistant:

void QMainWindowLayout::setCorner(Qt::Corner corner, Qt::DockWidgetArea area)
{
    if (layoutState.dockAreaLayout.corners[corner] == area)
        return;
    layoutState.dockAreaLayout.corners[corner] = area;
    if (savedState.isValid())
        savedState.dockAreaLayout.corners[corner] = area;
    invalidate();
}